

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O2

void xlsxioread_list_sheets
               (xlsxioreader handle,xlsxioread_list_sheets_callback_fn callback,void *callbackdata)

{
  main_sheet_list_callback_data sheetcallbackdata;
  undefined8 local_30;
  xlsxioread_list_sheets_callback_fn local_28;
  void *local_20;
  
  if (callback != (xlsxioread_list_sheets_callback_fn)0x0 && handle != (xlsxioreader)0x0) {
    local_30 = 0;
    local_28 = callback;
    local_20 = callbackdata;
    iterate_files_by_contenttype
              (handle->zip,
               "application/vnd.openxmlformats-officedocument.spreadsheetml.sheet.main+xml",
               xlsxioread_list_sheets_callback,&local_30,(XML_Parser *)&local_30);
    iterate_files_by_contenttype
              (handle->zip,"application/vnd.ms-excel.sheet.macroEnabled.main+xml",
               xlsxioread_list_sheets_callback,&local_30,(XML_Parser *)&local_30);
    iterate_files_by_contenttype
              (handle->zip,
               "application/vnd.openxmlformats-officedocument.spreadsheetml.template.main+xml",
               xlsxioread_list_sheets_callback,&local_30,(XML_Parser *)&local_30);
    iterate_files_by_contenttype
              (handle->zip,"application/vnd.ms-excel.template.macroEnabled.main+xml",
               xlsxioread_list_sheets_callback,&local_30,(XML_Parser *)&local_30);
  }
  return;
}

Assistant:

DLL_EXPORT_XLSXIO void xlsxioread_list_sheets (xlsxioreader handle, xlsxioread_list_sheets_callback_fn callback, void* callbackdata)
{
  if (!handle || !callback)
    return;
  //process contents of main sheet
  struct main_sheet_list_callback_data sheetcallbackdata = {
    .xmlparser = NULL,
    .callback = callback,
    .callbackdata = callbackdata
  };
  iterate_files_by_contenttype(handle->zip, xlsx_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xlsm_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xltx_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
  iterate_files_by_contenttype(handle->zip, xltm_content_type, xlsxioread_list_sheets_callback, &sheetcallbackdata, &sheetcallbackdata.xmlparser);
}